

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_message_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
DataDictionaryMessageTest_TestDiscardFieldTypesAreNotEncodedInADictionaryMessage_Test::
~DataDictionaryMessageTest_TestDiscardFieldTypesAreNotEncodedInADictionaryMessage_Test
          (DataDictionaryMessageTest_TestDiscardFieldTypesAreNotEncodedInADictionaryMessage_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DataDictionaryMessageTest, TestDiscardFieldTypesAreNotEncodedInADictionaryMessage)
{
    FieldDef bid(0, FieldTypeEnum::DOUBLE, "Bid");
    FieldDef discarded(2, FieldTypeEnum::DISCARD, "Discarded");
    FieldDef ask(2, FieldTypeEnum::DOUBLE, "Ask");
    std::vector<FieldDef> fields = {bid, discarded, ask};
    DataDictionaryMessage message = DataDictionaryMessage(fields, false);

    EXPECT_EQ(2, message.GetFieldDefs().size());
    EXPECT_EQ(bid, message.GetFieldDefs().at(0));
    EXPECT_EQ(ask, message.GetFieldDefs().at(1));
}